

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O1

void monster_groups_verify(chunk_conflict *c)

{
  wchar_t wVar1;
  monster *pmVar2;
  ulong uVar3;
  mon_group_list_entry *pmVar4;
  char *fmt;
  ulong uVar5;
  
  if (z_info->level_monster_max != 0) {
    uVar5 = 0;
    do {
      if (c->monster_groups[uVar5] != (monster_group *)0x0) {
        for (pmVar4 = c->monster_groups[uVar5]->member_list; pmVar4 != (mon_group_list_entry *)0x0;
            pmVar4 = pmVar4->next) {
          pmVar2 = cave_monster(c,pmVar4->midx);
          uVar3 = (ulong)(uint)pmVar2->group_info[0].index;
          if (uVar5 != uVar3) {
            wVar1 = pmVar2->group_info[1].index;
            if ((ulong)(uint)wVar1 == 0) {
              fmt = "Bad group index: group: %d, monster: %d";
            }
            else {
              if (uVar5 != (uint)wVar1) {
                quit_fmt("Bad group index: group: %d, monster: %d",uVar5 & 0xffffffff,
                         (ulong)(uint)wVar1);
              }
              if (pmVar2->group_info[1].role == MON_GROUP_LEADER) goto LAB_00168112;
              uVar3 = (ulong)(uint)pmVar2->group_info[1].index;
              fmt = "Bad monster role: group: %d, monster: %d";
            }
            quit_fmt(fmt,uVar5 & 0xffffffff,uVar3);
          }
LAB_00168112:
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < z_info->level_monster_max);
  }
  return;
}

Assistant:

void monster_groups_verify(struct chunk *c)
{
	int i;

	for (i = 0; i < z_info->level_monster_max; i++) {
		if (c->monster_groups[i]) {
			struct monster_group *group = c->monster_groups[i];
			struct mon_group_list_entry *entry = group->member_list;
			while (entry) {
				struct monster *mon = cave_monster(c, entry->midx);
				struct monster_group_info *info = mon->group_info;
				if (info[PRIMARY_GROUP].index != i) {
					if (info[SUMMON_GROUP].index) {
						if (info[SUMMON_GROUP].index != i) {
							quit_fmt("Bad group index: group: %d, monster: %d",
									 i, info[SUMMON_GROUP].index);
						}
						if (info[SUMMON_GROUP].role != MON_GROUP_LEADER) {
							quit_fmt("Bad monster role: group: %d, monster: %d",
									 i, info[SUMMON_GROUP].index);
						}
					} else {
						quit_fmt("Bad group index: group: %d, monster: %d",
								 i, info[PRIMARY_GROUP].index);
					}
				}
				entry = entry->next;
			}
		}
	}
}